

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O3

void __thiscall FBX::Stream::Stream(Stream *this,string *path)

{
  int __fd;
  char *pcVar1;
  size_t sVar2;
  runtime_error *prVar3;
  stat st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [48];
  size_t local_90;
  
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  this->cursor = 0;
  pcVar1 = realpath((path->_M_dataplus)._M_p,(char *)0x0);
  if (pcVar1 == (char *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "Failed to open file ",path);
    std::runtime_error::runtime_error(prVar3,(string *)local_c0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c0._0_8_ = local_c0 + 0x10;
  sVar2 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,pcVar1,pcVar1 + sVar2);
  std::__cxx11::string::operator=((string *)this,(string *)local_c0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  free(pcVar1);
  memset((stat *)local_c0,0,0x90);
  stat((this->path)._M_dataplus._M_p,(stat *)local_c0);
  this->fileSize = local_90;
  __fd = open((this->path)._M_dataplus._M_p,0,0);
  if (__fd != -1) {
    pcVar1 = (char *)mmap((void *)0x0,this->fileSize,1,2,__fd,0);
    this->data = pcVar1;
    if (pcVar1 != (char *)0xffffffffffffffff) {
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_e0,"Failed to map file ",path);
    std::runtime_error::runtime_error(prVar3,(string *)&local_e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e0,"Failed to open file ",path);
  std::runtime_error::runtime_error(prVar3,(string *)&local_e0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Stream::Stream(const std::string &path) {
#if defined(__unix__) || defined(__APPLE__)
        char *temp = realpath(path.c_str(), nullptr);
        if (!temp)
            throw std::runtime_error("Failed to open file " + path);

        this->path = std::string(temp);
        free(temp);

        struct stat st{};
        stat(this->path.c_str(), &st);
        fileSize = st.st_size;
        int file = open(this->path.c_str(), O_RDONLY, 0);
        if (file == -1)
            throw std::runtime_error("Failed to open file " + path);

        data = static_cast<char *>(mmap(nullptr, fileSize, PROT_READ, MAP_PRIVATE, file, 0));
        if (data == MAP_FAILED)
            throw std::runtime_error("Failed to map file " + path);
#elif __WIN32__
        auto buffer = new char[512];
        GetFullPathName(path.c_str(), 512, buffer, nullptr);
        this->path = reinterpret_cast<const char *>(buffer);

        file = CreateFile(
                this->path.c_str(),
                GENERIC_READ,
                0,
                nullptr,
                OPEN_EXISTING,
                0,
                nullptr
        );
        if (!file)
            throw std::runtime_error("Failed to open file " + path);

        map = CreateFileMapping(file, nullptr, PAGE_READONLY, 0, 0, nullptr);
        if (!map) {
            CloseHandle(file);
            throw std::runtime_error("Failed to create file mapping " + path);
        }

        data = (char *) MapViewOfFile(map, FILE_MAP_READ, 0, 0, 0);
        if (!data) {
            CloseHandle(map);
            CloseHandle(file);
            throw std::runtime_error("Failed to memory map file " + path);
        }
#endif
    }